

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.h
# Opt level: O2

void __thiscall IntVar::printLit(IntVar *this,int val,LitRel type)

{
  char *__format;
  
  printf("[v%d ",(ulong)(uint)this->var_id);
  switch(type) {
  case LR_NE:
    __format = "!= %d]";
    break;
  case LR_EQ:
    __format = "== %d]";
    break;
  case LR_GE:
    val = val + 1;
    __format = ">= %d]";
    break;
  case LR_LE:
    __format = "<= %d]";
    break;
  default:
    return;
  }
  printf(__format,(ulong)(uint)val);
  return;
}

Assistant:

inline void IntVar::printLit(int val, LitRel type) const {
		printf("[v%d ", var_id);
		switch (type) {
			case LR_NE:
				printf("!= %d]", val);
				break;
			case LR_EQ:
				printf("== %d]", val);
				break;
			case LR_GE:
				printf(">= %d]", val + 1);
				break;
			case LR_LE:
				printf("<= %d]", val);
				break;
		}
	}